

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O2

bool __thiscall llbuild::ninja::Rule::isValidParameterName(Rule *this,StringRef name)

{
  int iVar1;
  char *__s2;
  bool bVar2;
  size_t sStack_20;
  
  bVar2 = false;
  switch(name.Data) {
  case (char *)0x4:
    if (*(int *)&(this->name)._M_dataplus._M_p != 0x73706564) {
      return *(int *)&(this->name)._M_dataplus._M_p == 0x6c6f6f70;
    }
    return true;
  default:
    goto switchD_0013593c_caseD_5;
  case (char *)0x6:
    __s2 = "restat";
    sStack_20 = 6;
    break;
  case (char *)0x7:
    iVar1 = bcmp(this,"command",7);
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = bcmp(this,"depfile",7);
    if (iVar1 == 0) {
      return true;
    }
    __s2 = "rspfile";
    sStack_20 = 7;
    break;
  case (char *)0x9:
    __s2 = "generator";
    sStack_20 = 9;
    break;
  case (char *)0xb:
    __s2 = "description";
    sStack_20 = 0xb;
    break;
  case (char *)0xf:
    __s2 = "rspfile_content";
    sStack_20 = 0xf;
  }
  iVar1 = bcmp(this,__s2,sStack_20);
  bVar2 = iVar1 == 0;
switchD_0013593c_caseD_5:
  return bVar2;
}

Assistant:

bool Rule::isValidParameterName(StringRef name) {
  return name == "command" ||
    name == "description" ||
    name == "deps" ||
    name == "depfile" ||
    name == "generator" ||
    name == "pool" ||
    name == "restat" ||
    name == "rspfile" ||
    name == "rspfile_content";
}